

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_utils.hpp
# Opt level: O0

idx_t duckdb::CountZeros<duckdb::uhugeint_t>::Leading(uhugeint_t value)

{
  long in_RSI;
  long in_RDI;
  uint64_t lower;
  uint64_t upper;
  uint64_t in_stack_000001e8;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    if (in_RDI == 0) {
      local_8 = 0x80;
    }
    else {
      local_8 = CountZeros<unsigned_long>::Leading(in_stack_000001e8);
      local_8 = local_8 + 0x40;
    }
  }
  else {
    local_8 = CountZeros<unsigned_long>::Leading(in_stack_000001e8);
  }
  return local_8;
}

Assistant:

inline static idx_t Leading(uhugeint_t value) {
		const uint64_t upper = static_cast<uint64_t>(value.upper);
		const uint64_t lower = value.lower;

		if (upper) {
			return CountZeros<uint64_t>::Leading(upper);
		} else if (lower) {
			return 64 + CountZeros<uint64_t>::Leading(lower);
		} else {
			return 128;
		}
	}